

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLin>
               (GetterXsYs<short> *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  long lVar5;
  ImPlotContext *pIVar6;
  int iVar7;
  ImPlotContext *gp;
  ImPlotContext *pIVar8;
  int iVar9;
  float fVar10;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar4 = GImPlot->CurrentPlot;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar7 = getter->Count;
    local_48 = iVar7 + -1;
    lVar5 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    iVar7 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar7].Min;
    local_3c.x = (float)(GImPlot->Mx *
                         ((double)(int)*(short *)((long)getter->Xs + lVar5) -
                         (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
    local_3c.y = (float)(GImPlot->My[iVar7] *
                         ((double)(int)((long)((ulong)*(ushort *)((long)getter->Ys + lVar5) << 0x30)
                                       >> 0x30) - pIVar4->YAxis[iVar7].Range.Min) + (double)IVar2.y)
    ;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLinLin> *)local_58,
               DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar7 = getter->Count;
    lVar5 = (long)((getter->Offset % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
    iVar9 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar9].Min;
    local_58._4_4_ =
         (undefined4)
         (GImPlot->My[iVar9] *
          ((double)(int)*(short *)((long)getter->Ys + lVar5) - pIVar4->YAxis[iVar9].Range.Min) +
         (double)IVar2.y);
    local_58._0_4_ =
         (undefined4)
         (GImPlot->Mx *
          ((double)(int)((long)((ulong)*(ushort *)((long)getter->Xs + lVar5) << 0x30) >> 0x30) -
          (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
    if (1 < iVar7) {
      iVar9 = 1;
      local_60 = GImPlot;
      pIVar6 = GImPlot;
      pIVar8 = GImPlot;
      do {
        lVar5 = (long)(((getter->Offset + iVar9) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        iVar3 = transformer->YAxis;
        IVar2 = pIVar6->PixelRange[iVar3].Min;
        local_68.x = (float)(pIVar6->Mx *
                             ((double)(int)*(short *)((long)getter->Xs + lVar5) -
                             (pIVar6->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
        local_68.y = (float)(pIVar6->My[iVar3] *
                             ((double)(int)((long)((ulong)*(ushort *)((long)getter->Ys + lVar5) <<
                                                  0x30) >> 0x30) -
                             pIVar6->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y);
        pIVar4 = pIVar8->CurrentPlot;
        fVar10 = (float)local_58._4_4_;
        if (local_68.y <= (float)local_58._4_4_) {
          fVar10 = local_68.y;
        }
        if ((fVar10 < (pIVar4->PlotRect).Max.y) &&
           (fVar10 = (float)(~-(uint)(local_68.y <= (float)local_58._4_4_) & (uint)local_68.y |
                            -(uint)(local_68.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar10 && fVar10 != *pfVar1)) {
          fVar10 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar10 = local_68.x;
          }
          if ((fVar10 < (pIVar4->PlotRect).Max.x) &&
             (fVar10 = (float)(-(uint)(local_68.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x),
             (pIVar4->PlotRect).Min.x <= fVar10 && fVar10 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_68,col,line_weight);
            iVar7 = getter->Count;
            pIVar6 = GImPlot;
            pIVar8 = local_60;
          }
        }
        iVar9 = iVar9 + 1;
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
      } while (iVar9 < iVar7);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}